

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::ProfiledNewScFltArray
              (AuxArray<double> *doubles,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  ThreadContext *pTVar1;
  SparseArraySegmentBase *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  Var ptr;
  ulong srcCount;
  long lVar7;
  uint local_54;
  RecyclerWeakReference<Js::FunctionBody> *pRStack_50;
  int32 ival;
  ScriptContext *local_48;
  JavascriptNativeArray *local_40;
  bool local_31;
  
  pTVar1 = scriptContext->threadContext;
  local_31 = pTVar1->noJsReentrancy;
  pTVar1->noJsReentrancy = true;
  local_48 = scriptContext;
  bVar4 = ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
  if (bVar4) {
    ArrayCallSiteInfo::SetIsNotNativeIntArray(arrayInfo);
    uVar5 = doubles->count;
    srcCount = (ulong)uVar5;
    pRStack_50 = weakFuncRef;
    local_40 = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                          ((local_48->super_ScriptContextBase).javascriptLibrary,uVar5)->
                super_JavascriptNativeArray;
    pSVar2 = (((JavascriptNativeArray *)&local_40->super_JavascriptArray)->super_JavascriptArray).
             head.ptr;
    if ((uVar5 == 0) || (uVar5 != pSVar2->length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x434,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar4) {
LAB_00a41174:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      uVar5 = pSVar2->length;
    }
    Memory::CopyArray<double,double,Memory::Recycler>
              ((double *)(pSVar2 + 1),(ulong)uVar5,(double *)(doubles + 1),srcCount);
    JavascriptNativeArray::SetArrayProfileInfo(local_40,pRStack_50,arrayInfo);
  }
  else {
    uVar5 = doubles->count;
    local_40 = (JavascriptNativeArray *)
               JavascriptLibrary::CreateArrayLiteral
                         ((local_48->super_ScriptContextBase).javascriptLibrary,uVar5);
    pSVar2 = (local_40->super_JavascriptArray).head.ptr;
    if (((ulong)uVar5 == 0) || (uVar5 != pSVar2->length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x43e,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar4) goto LAB_00a41174;
      *puVar6 = 0;
    }
    for (lVar7 = 0; (ulong)uVar5 << 3 != lVar7; lVar7 = lVar7 + 8) {
      pRStack_50 = *(RecyclerWeakReference<Js::FunctionBody> **)((long)&doubles[1].count + lVar7);
      bVar4 = JavascriptNumber::TryGetInt32Value<false>((double)pRStack_50,(int32 *)&local_54);
      if (bVar4) {
        Memory::WriteBarrierPtr<void>::WriteBarrierSet
                  ((WriteBarrierPtr<void> *)((long)&pSVar2[1].left + lVar7),
                   (void *)((ulong)local_54 | 0x1000000000000));
      }
      else {
        ptr = JavascriptNumber::ToVarNoCheck((double)pRStack_50,local_48);
        Memory::WriteBarrierPtr<void>::WriteBarrierSet
                  ((WriteBarrierPtr<void> *)((long)&pSVar2[1].left + lVar7),ptr);
      }
    }
  }
  pTVar1->noJsReentrancy = local_31;
  return local_40;
}

Assistant:

Var JavascriptArray::ProfiledNewScFltArray(AuxArray<double> *doubles, ScriptContext* scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScFltArray, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        if (arrayInfo->IsNativeFloatArray())
        {
            arrayInfo->SetIsNotNativeIntArray();
            uint32 count = doubles->count;
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(count);
            SparseArraySegment<double> *head = SparseArraySegment<double>::From(arr->head);
            Assert(count > 0 && count == head->length);
            CopyArray(head->elements, head->length, doubles->elements, count);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        uint32 count = doubles->count;
        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(count);
        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(count > 0 && count == head->length);

        for (uint i = 0; i < count; i++)
        {
            double dval = doubles->elements[i];
            int32 ival;
            if (JavascriptNumber::TryGetInt32Value(dval, &ival) && !TaggedInt::IsOverflow(ival))
            {
                head->elements[i] = TaggedInt::ToVarUnchecked(ival);
            }
            else
            {
                head->elements[i] = JavascriptNumber::ToVarNoCheck(dval, scriptContext);
            }
        }

        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScFltArray);
    }